

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewOrderSingle.h
# Opt level: O0

void __thiscall FIX42::NewOrderSingle::NoAllocs::NoAllocs(NoAllocs *this)

{
  message_order local_30;
  NoAllocs *local_10;
  NoAllocs *this_local;
  
  local_10 = this;
  FIX::message_order::message_order(&local_30,0x4f,0x50,0);
  FIX::Group::Group(&this->super_Group,0x4e,0x4f,&local_30);
  FIX::message_order::~message_order(&local_30);
  *(undefined ***)&this->super_Group = &PTR__NoAllocs_00504b68;
  return;
}

Assistant:

NoAllocs() : FIX::Group(78,79,FIX::message_order(79,80,0)) {}